

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O3

void Seg_ManComputeDelay(Gia_Man_t *pGia,int DelayInit,int nFanouts,int fTwo,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  sat_solver *psVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Seg_Man_t *p;
  Vec_Int_t *vArray;
  Gia_Man_t *pGVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  ulong uVar13;
  char *__format;
  uint uVar14;
  timespec ts;
  uint local_54;
  timespec local_50;
  int local_3c;
  long local_38;
  
  iVar6 = clock_gettime(3,&local_50);
  if (iVar6 < 0) {
    local_38 = -1;
  }
  else {
    local_38 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p = Seg_ManAlloc(pGia,nFanouts);
  local_54 = DelayInit;
  if (DelayInit == 0) {
    local_54 = p->DelayMax;
  }
  if (fVerbose == 0) {
    iVar6 = 0;
  }
  else {
    sat_solver_nvars(p->pSat);
    printf("Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n",
           (ulong)local_54,(ulong)(fTwo + 1));
    iVar6 = fVerbose;
  }
  Seg_ManCreateCnf(p,fTwo,iVar6);
  sat_solver_set_resource_limits(p->pSat,0,0,0,0);
  psVar2 = p->pSat;
  psVar2->nRuntimeLimit = 0;
  psVar2->fNotUseRandom = 1;
  piVar3 = p->vPolars->pArray;
  uVar14 = p->vPolars->nSize;
  if (0 < psVar2->size) {
    lVar12 = 0;
    do {
      psVar2->polarity[lVar12] = '\0';
      lVar12 = lVar12 + 1;
    } while (lVar12 < psVar2->size);
  }
  if (0 < (int)uVar14) {
    uVar13 = 0;
    do {
      psVar2->polarity[piVar3[uVar13]] = '\x01';
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
  }
  if (p->DelayMax < 0) {
    Gia_ManEdgeFromArray(p->pGia,(Vec_Int_t *)0x0);
  }
  else {
    vArray = (Vec_Int_t *)0x0;
    uVar14 = p->DelayMax;
    local_3c = fVerbose;
    do {
      pGVar10 = p->pGia;
      pVVar11 = pGVar10->vCos;
      iVar6 = pVVar11->nSize;
      lVar12 = 0;
      if (0 < iVar6) {
        lVar12 = 0;
        do {
          iVar6 = pVVar11->pArray[lVar12];
          if (((long)iVar6 < 0) || (pGVar10->nObjs <= iVar6)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar4 = pGVar10->pObjs;
          pGVar1 = pGVar4 + iVar6 + -(ulong)((uint)*(undefined8 *)(pGVar4 + iVar6) & 0x1fffffff);
          if ((pGVar1 < pGVar4) || (pGVar4 + (uint)pGVar10->nObjs <= pGVar1)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar7 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
          if ((((int)uVar7 < 0) || (p->vFirsts->nSize <= (int)uVar7)) ||
             (p->vNvars->nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((int)uVar14 < p->vNvars->pArray[uVar7 & 0x7fffffff]) {
            iVar6 = p->vFirsts->pArray[uVar7 & 0x7fffffff] + uVar14;
            if (iVar6 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            iVar6 = sat_solver_push(p->pSat,iVar6 * 2 + 1);
            pGVar10 = p->pGia;
            if (iVar6 == 0) {
              iVar6 = pGVar10->vCos->nSize;
              break;
            }
          }
          lVar12 = lVar12 + 1;
          pVVar11 = pGVar10->vCos;
          iVar6 = pVVar11->nSize;
        } while (lVar12 < iVar6);
      }
      if ((int)lVar12 < iVar6) {
        __format = "Proved UNSAT for delay %d.  ";
LAB_007b9209:
        printf(__format,(ulong)uVar14);
        iVar8 = 3;
        iVar6 = clock_gettime(3,&local_50);
        if (iVar6 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        lVar12 = lVar12 - local_38;
        Abc_Print(iVar8,"%s =","Time");
        Abc_Print(iVar8,"%9.2f sec\n",(double)lVar12 / 1000000.0);
        break;
      }
      if ((int)uVar14 <= (int)local_54) {
        iVar6 = sat_solver_nconflicts(p->pSat);
        iVar8 = sat_solver_solve_internal(p->pSat);
        iVar9 = sat_solver_nconflicts(p->pSat);
        if (iVar8 != 1) {
          if (local_3c != 0) {
            __format = "Resource limit reached for delay %d.  ";
            if (iVar8 == -1) {
              __format = "Proved UNSAT for delay %d.  ";
            }
            goto LAB_007b9209;
          }
          break;
        }
        if (local_3c != 0) {
          iVar8 = p->nVars;
          if ((long)iVar8 < 1) {
            uVar13 = 0;
          }
          else {
            uVar7 = p->pSat->size;
            if ((int)uVar7 < 1) {
              uVar7 = 0;
            }
            if (uVar7 <= iVar8 - 1U) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            lVar12 = 0;
            uVar13 = 0;
            do {
              uVar13 = (ulong)((int)uVar13 + (uint)(p->pSat->model[lVar12] == 1));
              lVar12 = lVar12 + 1;
            } while (iVar8 != lVar12);
          }
          printf("Solution with delay %2d and %5d edges exists. Conf = %8d.  ",(ulong)uVar14,uVar13,
                 (ulong)(uint)(iVar9 - iVar6));
          iVar8 = 3;
          iVar6 = clock_gettime(3,&local_50);
          if (iVar6 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
          }
          lVar12 = lVar12 - local_38;
          Abc_Print(iVar8,"%s =","Time");
          Abc_Print(iVar8,"%9.2f sec\n",(double)lVar12 / 1000000.0);
        }
        if (vArray != (Vec_Int_t *)0x0) {
          if (vArray->pArray != (int *)0x0) {
            free(vArray->pArray);
          }
          free(vArray);
        }
        vArray = Seg_ManConvertResult(p);
      }
      bVar5 = 0 < (int)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar5);
    Gia_ManEdgeFromArray(p->pGia,vArray);
    if (vArray != (Vec_Int_t *)0x0) {
      if (vArray->pArray != (int *)0x0) {
        free(vArray->pArray);
      }
      free(vArray);
    }
  }
  Seg_ManStop(p);
  return;
}

Assistant:

void Seg_ManComputeDelay( Gia_Man_t * pGia, int DelayInit, int nFanouts, int fTwo, int fVerbose )
{
    int nBTLimit = 0;
    int nTimeOut = 0;
    int fVeryVerbose = 0;

    Gia_Obj_t * pObj;
    abctime clk = Abc_Clock();
    Vec_Int_t * vEdges2 = NULL;
    int i, iLut, iFirst, nVars, status, Delay, nConfs;
    Seg_Man_t * p = Seg_ManAlloc( pGia, nFanouts );
    int DelayStart = DelayInit ? DelayInit : p->DelayMax;

    if ( fVerbose )
    printf( "Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n", 
        DelayStart, fTwo+1, p->FirstVar, sat_solver_nvars(p->pSat) );
    Seg_ManCreateCnf( p, fTwo, fVerbose );
    //Sat_SolverWriteDimacs( p->pSat, "test_edge.cnf", NULL, NULL, 0 );
    // set resource limits
    sat_solver_set_resource_limits( p->pSat, nBTLimit, 0, 0, 0 );
    sat_solver_set_runtime_limit( p->pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    sat_solver_set_random( p->pSat, 1 );
    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolars), Vec_IntSize(p->vPolars) );
    //sat_solver_set_var_activity( p->pSat, NULL, p->nVars );
    // increment delay gradually
    for ( Delay = p->DelayMax; Delay >= 0; Delay-- )
    {
        // we constrain COs, although it would be fine to constrain only POs
        Gia_ManForEachCoDriver( p->pGia, pObj, i )
        {
            iLut   = Gia_ObjId( p->pGia, pObj );
            iFirst = Vec_IntEntry( p->vFirsts, iLut );
            nVars  = Vec_IntEntry( p->vNvars, iLut );
            if ( Delay < nVars && !sat_solver_push(p->pSat, Abc_Var2Lit(iFirst + Delay, 1)) )
                break;
        }
        if ( i < Gia_ManCoNum(p->pGia) )
        {
            printf( "Proved UNSAT for delay %d.  ", Delay );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            break;
        }
        if ( Delay > DelayStart )
            continue;
        // solve with assumptions
        //clk = Abc_Clock();
        nConfs = sat_solver_nconflicts( p->pSat );
        status = sat_solver_solve_internal( p->pSat );
        nConfs = sat_solver_nconflicts( p->pSat ) - nConfs;
        if ( status == l_True )
        {
            if ( fVerbose )
            {
                int Count = 0;
                for ( i = 0; i < p->nVars; i++ )
                    Count += sat_solver_var_value(p->pSat, i);
                printf( "Solution with delay %2d and %5d edges exists. Conf = %8d.  ", Delay, Count, nConfs );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            // save the result
            Vec_IntFreeP( &vEdges2 );
            vEdges2 = Seg_ManConvertResult( p );
            if ( fVeryVerbose )
            {
                for ( i = 0; i < p->nVars; i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "   " );

                for ( i = p->nVars; i < sat_solver_nvars(p->pSat); i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
            }
        }
        else
        {
            if ( fVerbose )
            {
                if ( status == l_False )
                    printf( "Proved UNSAT for delay %d.  ", Delay );
                else
                    printf( "Resource limit reached for delay %d.  ", Delay );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            break;
        }
    }
    Gia_ManEdgeFromArray( p->pGia, vEdges2 );
    Vec_IntFreeP( &vEdges2 );
    Seg_ManStop( p );
}